

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall r_comp::Preprocessor::initialize(Preprocessor *this,Metadata *metadata)

{
  vector<r_comp::Class> *this_00;
  element_type *peVar1;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  uchar uVar4;
  int iVar5;
  ReturnType t;
  mapped_type *pmVar6;
  long lVar7;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  Class *pCVar10;
  Class *pCVar11;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  Preprocessor *this_02;
  Atom *this_03;
  Atom atom;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> members;
  Atom local_3f4 [4];
  Atom local_3f0 [4];
  Atom local_3ec [4];
  undefined4 local_3e8;
  undefined4 local_3e4;
  Atom local_3e0 [4];
  Atom local_3dc [4];
  string class_name;
  Ptr replistruct;
  Ptr s;
  string sset;
  string base_class;
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  tpl_args;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> r_type;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> r_xpr;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_278;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_258;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_248;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_230;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_218;
  string local_200;
  string local_1e0;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_1c0;
  string local_1a8;
  undefined1 local_188 [40];
  string local_160;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_140;
  string local_128;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90 [32];
  value_type local_70;
  value_type local_50;
  
  this->m_metadata = metadata;
  this->m_classOpcode = 0;
  r_xpr.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  r_xpr.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  r_xpr.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r_code::Atom::Object((ushort)local_3dc,'\0');
  std::__cxx11::string::string((string *)&local_b0,Class::Expression,(allocator *)&class_name);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_230,&r_xpr);
  Class::Class((Class *)&base_class,local_3dc,&local_b0,&local_230,ANY);
  std::__cxx11::string::string((string *)&sset,Class::Expression,(allocator *)&r_type);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)metadata,&sset);
  Class::operator=(pmVar6,(Class *)&base_class);
  std::__cxx11::string::~string((string *)&sset);
  Class::~Class((Class *)&base_class);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_230);
  std::__cxx11::string::~string((string *)&local_b0);
  r_code::Atom::~Atom(local_3dc);
  iVar5 = *(int *)&this->m_classOpcode + 1;
  this->m_classOpcode = (uint16_t)iVar5;
  r_type.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  r_type.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  r_type.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r_code::Atom::Object((ushort)local_3e0,(uchar)iVar5);
  std::__cxx11::string::string((string *)&local_d0,Class::Type,(allocator *)&class_name);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_248,&r_type);
  Class::Class((Class *)&base_class,local_3e0,&local_d0,&local_248,ANY);
  std::__cxx11::string::string((string *)&sset,Class::Type,(allocator *)&members);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)metadata,&sset);
  Class::operator=(pmVar6,(Class *)&base_class);
  std::__cxx11::string::~string((string *)&sset);
  Class::~Class((Class *)&base_class);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_248);
  std::__cxx11::string::~string((string *)&local_d0);
  r_code::Atom::~Atom(local_3e0);
  this->m_classOpcode = this->m_classOpcode + 1;
  peVar1 = (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = &((peVar1->args).
              super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = *(__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(peVar1->args).
                    super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  this_00 = &metadata->classes_by_opcodes;
  uVar4 = '\0';
  do {
    if (p_Var12 == p_Var2) {
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                (&r_type);
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                (&r_xpr);
      return;
    }
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
               p_Var12);
    if ((replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        type == Directive) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                 &(((replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->args).
                   super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      members.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      members.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      members.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar3 = std::operator==(&(replistruct.
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->cmd,"!class");
      if (bVar3) {
        std::__cxx11::string::string((string *)&sset,"[]",(allocator *)&base_class);
        std::__cxx11::string::string
                  ((string *)&class_name,
                   (string *)
                   &(s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    cmd);
        lVar7 = std::__cxx11::string::find((string *)&class_name,(ulong)&sset);
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)&base_class,(ulong)&class_name);
          std::__cxx11::string::operator=((string *)&class_name,(string *)&base_class);
          std::__cxx11::string::~string((string *)&base_class);
        }
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_258,&s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                  );
        bVar3 = isTemplateClass(this,(Ptr *)&local_258);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
        if (bVar3) {
          this_01 = &std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&this->m_templateClasses,&class_name)->
                     super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_01,&s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
          ;
        }
        else {
          tpl_args.
          super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ._M_impl._M_node._M_size = 0;
          tpl_args.
          super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&tpl_args;
          tpl_args.
          super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&tpl_args;
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_268,
                     &s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          getMembers(this,(Ptr *)&local_268,&members,&tpl_args,false);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
          r_code::Atom::Atom(&atom,0xffffffff);
          bVar3 = std::operator==(&class_name,"grp");
          if (bVar3) {
            r_code::Atom::Group((ushort)&base_class,(uchar)this->m_classOpcode);
            r_code::Atom::operator=(&atom,(Atom *)&base_class);
          }
          else {
            bVar3 = std::operator==(&class_name,"ipgm");
            if (bVar3) {
              r_code::Atom::InstantiatedProgram((ushort)&base_class,(uchar)this->m_classOpcode);
              r_code::Atom::operator=(&atom,(Atom *)&base_class);
            }
            else {
              bVar3 = std::operator==(&class_name,"icpp_pgm");
              if (bVar3) {
                r_code::Atom::InstantiatedCPPProgram((ushort)&base_class,(uchar)this->m_classOpcode)
                ;
                r_code::Atom::operator=(&atom,(Atom *)&base_class);
              }
              else {
                bVar3 = std::operator==(&class_name,"cst");
                if (bVar3) {
                  r_code::Atom::CompositeState((ushort)&base_class,(uchar)this->m_classOpcode);
                  r_code::Atom::operator=(&atom,(Atom *)&base_class);
                }
                else {
                  bVar3 = std::operator==(&class_name,"mdl");
                  if (bVar3) {
                    r_code::Atom::Model((ushort)&base_class,(uchar)this->m_classOpcode);
                    r_code::Atom::operator=(&atom,(Atom *)&base_class);
                  }
                  else {
                    lVar8 = std::__cxx11::string::find((char *)&class_name,0x146729);
                    if (lVar8 == -1) {
                      r_code::Atom::Object((ushort)&base_class,(uchar)this->m_classOpcode);
                      r_code::Atom::operator=(&atom,(Atom *)&base_class);
                    }
                    else {
                      r_code::Atom::Marker((ushort)&base_class,(uchar)this->m_classOpcode);
                      r_code::Atom::operator=(&atom,(Atom *)&base_class);
                    }
                  }
                }
              }
            }
          }
          r_code::Atom::~Atom((Atom *)&base_class);
          iVar5 = 2;
          if (lVar7 == -1) {
            std::__cxx11::string::string
                      ((string *)&base_class,
                       (string *)
                       &(((((s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->args).
                           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        )->cmd);
            bVar3 = std::operator==(&base_class,"_obj");
            if (bVar3) {
LAB_00140684:
              iVar5 = 1;
            }
            else {
              bVar3 = std::operator==(&base_class,"_grp");
              if (bVar3) goto LAB_00140684;
              bVar3 = std::operator==(&base_class,"_fact");
              iVar5 = 0;
              if (bVar3) goto LAB_00140684;
            }
            std::__cxx11::string::~string((string *)&base_class);
          }
          pbVar9 = r_code::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator[](&metadata->class_names,(ulong)this->m_classOpcode);
          std::__cxx11::string::_M_assign((string *)pbVar9);
          if (iVar5 == 0) {
            local_3e8 = _atom;
            std::__cxx11::string::string((string *)&local_128,(string *)&class_name);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      (&local_140,&members);
            Class::Class((Class *)&base_class,(Atom *)&local_3e8,&local_128,&local_140,ANY);
            pmVar6 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)metadata,&class_name);
            pCVar10 = Class::operator=(pmVar6,(Class *)&base_class);
            pCVar11 = r_code::vector<r_comp::Class>::operator[](this_00,(ulong)this->m_classOpcode);
            Class::operator=(pCVar11,pCVar10);
            Class::~Class((Class *)&base_class);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      (&local_140);
            std::__cxx11::string::~string((string *)&local_128);
            this_03 = (Atom *)&local_3e8;
          }
          else if (iVar5 == 2) {
            r_code::Atom::SSet((ushort)local_3ec,(uchar)this->m_classOpcode);
            std::__cxx11::string::string((string *)&local_160,(string *)&class_name);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       (local_188 + 0x10),&members);
            Class::Class((Class *)&base_class,local_3ec,&local_160,
                         (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          *)(local_188 + 0x10),ANY);
            pmVar6 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)metadata,&class_name);
            pCVar10 = Class::operator=(pmVar6,(Class *)&base_class);
            pCVar11 = r_code::vector<r_comp::Class>::operator[](this_00,(ulong)this->m_classOpcode);
            Class::operator=(pCVar11,pCVar10);
            Class::~Class((Class *)&base_class);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       (local_188 + 0x10));
            std::__cxx11::string::~string((string *)&local_160);
            this_03 = local_3ec;
          }
          else {
            local_3e4 = _atom;
            std::__cxx11::string::string((string *)&local_f0,(string *)&class_name);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      (&local_108,&members);
            Class::Class((Class *)&base_class,(Atom *)&local_3e4,&local_f0,&local_108,ANY);
            pmVar6 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&metadata->sys_classes,&class_name);
            pCVar10 = Class::operator=(pmVar6,(Class *)&base_class);
            pmVar6 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)metadata,&class_name);
            pCVar10 = Class::operator=(pmVar6,pCVar10);
            pCVar11 = r_code::vector<r_comp::Class>::operator[](this_00,(ulong)this->m_classOpcode);
            Class::operator=(pCVar11,pCVar10);
            Class::~Class((Class *)&base_class);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      (&local_108);
            std::__cxx11::string::~string((string *)&local_f0);
            this_03 = (Atom *)&local_3e4;
          }
          r_code::Atom::~Atom(this_03);
          this->m_classOpcode = this->m_classOpcode + 1;
          r_code::Atom::~Atom(&atom);
          std::__cxx11::
          _List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::_M_clear(&tpl_args.
                      super__List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    );
        }
        std::__cxx11::string::~string((string *)&class_name);
        std::__cxx11::string::~string((string *)&sset);
      }
      else {
        bVar3 = std::operator==(&(replistruct.
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->cmd,"!op");
        if (bVar3) {
          class_name.field_2._M_allocated_capacity = 0;
          class_name._M_dataplus._M_p = (pointer)&class_name;
          class_name._M_string_length = (size_type)&class_name;
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_278,
                     &s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          getMembers(this,(Ptr *)&local_278,&members,
                     (list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                      *)&class_name,false);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
          this_02 = (Preprocessor *)local_188;
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)local_188,
                     &s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          t = getReturnType(this_02,(Ptr *)local_188);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8));
          std::__cxx11::string::string
                    ((string *)&sset,
                     (string *)
                     &(s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->cmd);
          std::__cxx11::string::string((string *)&local_50,(string *)&sset);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&(metadata->operator_names).m_vector,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          r_code::Atom::Operator((ushort)local_3f0,uVar4);
          std::__cxx11::string::string((string *)&local_1a8,(string *)&sset);
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                    (&local_1c0,&members);
          Class::Class((Class *)&base_class,local_3f0,&local_1a8,&local_1c0,t);
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)metadata,&sset);
          Class::operator=(pmVar6,(Class *)&base_class);
          Class::~Class((Class *)&base_class);
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                    (&local_1c0);
          std::__cxx11::string::~string((string *)&local_1a8);
          r_code::Atom::~Atom(local_3f0);
          uVar4 = uVar4 + '\x01';
          std::__cxx11::string::~string((string *)&sset);
          std::__cxx11::
          _List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::_M_clear((_List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                      *)&class_name);
        }
        else {
          bVar3 = std::operator==(&(replistruct.
                                    super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->cmd,"!dfn");
          if (bVar3) {
            class_name._M_dataplus._M_p = (pointer)0x0;
            class_name._M_string_length = 0;
            class_name.field_2._M_allocated_capacity = 0;
            std::__cxx11::string::string((string *)&local_1e0,"",(allocator *)&sset);
            std::__cxx11::string::string(local_90,"",(allocator *)&tpl_args);
            StructureMember::StructureMember
                      ((StructureMember *)&base_class,(_Read)Compiler::read_set,(string *)0x0,
                       &local_1e0,(Iteration)local_90);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
            emplace_back<r_comp::StructureMember>
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       &class_name,(StructureMember *)&base_class);
            StructureMember::~StructureMember((StructureMember *)&base_class);
            std::__cxx11::string::~string(local_90);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::string::string
                      ((string *)&sset,
                       (string *)
                       &(s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->cmd);
            std::__cxx11::string::string((string *)&local_70,(string *)&sset);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&(metadata->function_names).m_vector,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            r_code::Atom::DeviceFunction((ushort)local_3f4);
            std::__cxx11::string::string((string *)&local_200,(string *)&sset);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      (&local_218,
                       (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       &class_name);
            Class::Class((Class *)&base_class,local_3f4,&local_200,&local_218,ANY);
            pmVar6 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)metadata,&sset);
            Class::operator=(pmVar6,(Class *)&base_class);
            Class::~Class((Class *)&base_class);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      (&local_218);
            std::__cxx11::string::~string((string *)&local_200);
            r_code::Atom::~Atom(local_3f4);
            std::__cxx11::string::~string((string *)&sset);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       &class_name);
          }
        }
      }
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                (&members);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&s.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var12 = p_Var12 + 1;
  } while( true );
}

Assistant:

void Preprocessor::initialize(Metadata *metadata)
{
    this->m_metadata = metadata;
    m_classOpcode = 0;
    uint16_t function_opcode = 0;
    uint16_t operator_opcode = 0;
    std::vector<StructureMember> r_xpr;
    metadata->classes[std::string(Class::Expression)] = Class(Atom::Object(m_classOpcode, 0), Class::Expression, r_xpr); // to read unspecified expressions in classes and sets.
    ++m_classOpcode;
    std::vector<StructureMember> r_type;
    metadata->classes[std::string(Class::Type)] = Class(Atom::Object(m_classOpcode, 0), Class::Type, r_type); // to read object types in expressions and sets.
    ++m_classOpcode;

    for (RepliStruct::Ptr replistruct : root->args) {
        if (replistruct->type != RepliStruct::Directive) {
            continue;
        }

        RepliStruct::Ptr s = replistruct->args.front();
        std::vector<StructureMember> members;

        if (replistruct->cmd == "!class") {
            std::string sset = "[]";
            std::string class_name = s->cmd;
            size_t p = class_name.find(sset);
            ClassType class_type = (p == std::string::npos ? T_CLASS : T_SET);

            if (class_type == T_SET) { // remove the trailing [] since the RepliStructs for instantiated classes do so.
                class_name = class_name.substr(0, class_name.length() - sset.length());
            }

            if (isTemplateClass(s)) {
                m_templateClasses[class_name] = s;
                continue;
            }

            std::list<RepliStruct::Ptr> tpl_args;
            getMembers(s, members, tpl_args, false);
            Atom atom;

            if (class_name == "grp") {
                atom = Atom::Group(m_classOpcode, members.size());
            } else if (class_name == "ipgm") {
                atom = Atom::InstantiatedProgram(m_classOpcode, members.size());
            } else if (class_name == "icpp_pgm") {
                atom = Atom::InstantiatedCPPProgram(m_classOpcode, members.size());
            } else if (class_name == "cst") {
                atom = Atom::CompositeState(m_classOpcode, members.size());
            } else if (class_name == "mdl") {
                atom = Atom::Model(m_classOpcode, members.size());
            } else if (class_name.find("mk.") != std::string::npos) {
                atom = Atom::Marker(m_classOpcode, members.size());
            } else {
                atom = Atom::Object(m_classOpcode, members.size());
            }

            if (class_type == T_CLASS) { // find out if the class is a sys class, i.e. is an instantiation of _obj, _grp or _fact.
                std::string base_class = s->args.front()->cmd;

                if (base_class == "_obj" || base_class == "_grp" || base_class == "_fact") {
                    class_type = T_SYS_CLASS;
                }
            }

            metadata->class_names[m_classOpcode] = class_name;

            switch (class_type) {
            case T_SYS_CLASS:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = metadata->sys_classes[class_name] = Class(atom, class_name, members);
                break;

            case T_CLASS:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = Class(atom, class_name, members);
                break;

            case T_SET:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = Class(Atom::SSet(m_classOpcode, members.size()), class_name, members);
                break;

            default:
                break;
            }

            ++m_classOpcode;
        } else if (replistruct->cmd == "!op") {
            std::list<RepliStruct::Ptr> tpl_args;
            getMembers(s, members, tpl_args, false);
            ReturnType return_type = getReturnType(s);
            std::string operator_name = s->cmd;
            metadata->operator_names.push_back(operator_name);
            metadata->classes[operator_name] = Class(Atom::Operator(operator_opcode, s->args.size()), operator_name, members, return_type);
            ++operator_opcode;
        } else if (replistruct->cmd == "!dfn") { // don't bother to read the members, it's always a set.
            std::vector<StructureMember> r_set;
            r_set.push_back(StructureMember(&Compiler::read_set, ""));
            std::string function_name = s->cmd;
            metadata->function_names.push_back(function_name);
            metadata->classes[function_name] = Class(Atom::DeviceFunction(function_opcode), function_name, r_set);
            ++function_opcode;
        }
    }
}